

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitRefNull(PrintExpressionContents *this,RefNull *curr)

{
  ostream *stream;
  HeapType type;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"ref.null ",9);
  Colors::outputColorCode(stream,"\x1b[0m");
  type = wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.
                     type);
  PrintSExpression::printHeapTypeName(this->parent,type);
  return;
}

Assistant:

void visitRefNull(RefNull* curr) {
    printMedium(o, "ref.null ");
    printHeapTypeName(curr->type.getHeapType());
  }